

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilFormatsTests
               (TestCaseGroup *group,TestParams *params)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *testCtx;
  pointer __src;
  TestParams *pTVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  CopyImageToImageTestCase *this;
  pointer __dest;
  ulong *puVar7;
  VkImageLayout extraout_EDX;
  VkImageLayout extraout_EDX_00;
  VkImageLayout layout;
  undefined8 in_RDX;
  undefined8 *extraout_RDX;
  undefined8 *puVar8;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar9;
  ulong __n;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t __n_00;
  string description;
  string testName;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  TestParams *local_c8;
  TestNode *local_c0;
  long local_b8;
  long local_b0;
  string local_a8;
  Data local_88;
  VkDeviceSize VStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  pointer pCStack_50;
  long local_48;
  anon_union_4_2_42ec4cd4_for_TestParams_4 local_40;
  
  paVar2 = &local_128.field_2;
  lVar4 = 0;
  local_c8 = params;
  local_c0 = &group->super_TestNode;
  do {
    (local_c8->src).image.operationLayout = (&DAT_00b04d30)[lVar4];
    local_b0 = 0;
    local_b8 = lVar4;
    do {
      pTVar3 = local_c8;
      paVar12 = &local_168.field_2;
      paVar11 = &local_148.field_2;
      (local_c8->dst).image.operationLayout = *(VkImageLayout *)((long)&DAT_00b04d38 + local_b0);
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_128,(_anonymous_namespace_ *)(ulong)(local_c8->src).image.operationLayout,
                 (VkImageLayout)in_RDX);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_168.field_2._M_allocated_capacity = *puVar7;
        local_168.field_2._8_8_ = plVar5[3];
        local_168._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar7;
        local_168._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_168._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_148,(_anonymous_namespace_ *)(ulong)(pTVar3->dst).image.operationLayout,
                 (VkImageLayout)local_168._M_string_length);
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar12) {
        uVar9 = local_168.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_148._M_string_length + local_168._M_string_length) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar11) {
          uVar9 = local_148.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_148._M_string_length + local_168._M_string_length)
        goto LAB_0046c048;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_148,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
      }
      else {
LAB_0046c048:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_168,(ulong)local_148._M_dataplus._M_p);
      }
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108.field_2._8_8_ = puVar6[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108._M_dataplus._M_p = (pointer)*puVar6;
      }
      puVar8 = puVar6 + 1;
      local_108._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      *puVar8 = 0;
      *(undefined1 *)psVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar11) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        puVar8 = extraout_RDX;
      }
      layout = (VkImageLayout)puVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar12) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        layout = extraout_EDX;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        layout = extraout_EDX_00;
      }
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_a8,(_anonymous_namespace_ *)(ulong)(pTVar3->src).image.operationLayout,
                 layout);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0xb05281);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_148.field_2._M_allocated_capacity = *puVar7;
        local_148.field_2._8_8_ = plVar5[3];
        local_148._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar7;
        local_148._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_148._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_128.field_2._M_allocated_capacity = *puVar7;
        local_128.field_2._8_8_ = plVar5[3];
        local_128._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *puVar7;
        local_128._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_128._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_e8,(_anonymous_namespace_ *)(ulong)(pTVar3->dst).image.operationLayout,
                 (VkImageLayout)local_128._M_string_length);
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        uVar9 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_e8._M_string_length + local_128._M_string_length) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          uVar9 = local_e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_e8._M_string_length + local_128._M_string_length)
        goto LAB_0046c20e;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_e8,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      }
      else {
LAB_0046c20e:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_128,(ulong)local_e8._M_dataplus._M_p);
      }
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_168.field_2._M_allocated_capacity = *psVar1;
        local_168.field_2._8_8_ = puVar6[3];
        local_168._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar1;
        local_168._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_168._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      __n = local_168._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        __n = local_e8.field_2._M_allocated_capacity + 1;
        operator_delete(local_e8._M_dataplus._M_p,__n);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        __n = local_128.field_2._M_allocated_capacity + 1;
        operator_delete(local_128._M_dataplus._M_p,__n);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar11) {
        __n = local_148.field_2._M_allocated_capacity + 1;
        operator_delete(local_148._M_dataplus._M_p,__n);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        __n = local_a8.field_2._M_allocated_capacity + 1;
        operator_delete(local_a8._M_dataplus._M_p,__n);
      }
      this = (CopyImageToImageTestCase *)operator_new(0xc0);
      testCtx = local_c0->m_testCtx;
      local_88.buffer.size = (Buffer)(pTVar3->src).buffer.size;
      local_88._8_8_ = *(undefined8 *)((long)&pTVar3->src + 8);
      local_88._16_8_ = *(undefined8 *)((long)&pTVar3->src + 0x10);
      VStack_70 = (pTVar3->dst).buffer.size;
      local_68 = *(undefined8 *)((long)&pTVar3->dst + 8);
      uStack_60 = *(undefined8 *)((long)&pTVar3->dst + 0x10);
      uVar10 = (long)(pTVar3->regions).
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar3->regions).
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_58 = (pointer)0x0;
      pCStack_50 = (pointer)0x0;
      local_48 = 0;
      __dest = std::
               _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                              *)(((long)uVar10 >> 4) * -0x3333333333333333),__n);
      local_48 = (long)__dest + uVar10;
      __src = (pTVar3->regions).
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __n_00 = (long)(pTVar3->regions).
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
      local_58 = __dest;
      if (__n_00 != 0) {
        pCStack_50 = __dest;
        memmove(__dest,__src,__n_00);
      }
      pCStack_50 = (pointer)(__n_00 + (long)__dest);
      local_40 = local_c8->field_3;
      CopyImageToImageTestCase::CopyImageToImageTestCase
                (this,testCtx,&local_108,&local_168,(TestParams *)&local_88.buffer);
      tcu::TestNode::addChild(local_c0,(TestNode *)this);
      in_RDX = extraout_RDX_00;
      if (__dest != (pointer)0x0) {
        operator_delete(__dest,uVar10);
        in_RDX = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_03;
      }
      local_b0 = local_b0 + 4;
    } while (local_b0 == 4);
    lVar4 = local_b8 + 1;
    if (local_b8 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void addImageToImageAllFormatsDepthStencilFormatsTests (tcu::TestCaseGroup* group, TestParams params)
{
	const VkImageLayout copySrcLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout copyDstLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(copySrcLayouts); ++srcLayoutNdx)
	{
		params.src.image.operationLayout = copySrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(copyDstLayouts); ++dstLayoutNdx)
		{
			params.dst.image.operationLayout = copyDstLayouts[dstLayoutNdx];

			const std::string testName		= getImageLayoutCaseName(params.src.image.operationLayout) + "_" +
											  getImageLayoutCaseName(params.dst.image.operationLayout);
			const std::string description	= "From layout " + getImageLayoutCaseName(params.src.image.operationLayout) +
											  " to " + getImageLayoutCaseName(params.dst.image.operationLayout);
			group->addChild(new CopyImageToImageTestCase(group->getTestContext(), testName, description, params));
		}
	}
}